

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O1

Move __thiscall Board::checkMove(Board *this,size_t row,size_t col)

{
  pointer puVar1;
  size_t sVar2;
  Move MVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (row != 0) {
    uVar4 = this->sizeInt * (row - 1) + col;
    puVar1 = (this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)(this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
    if (uVar5 <= uVar4) goto LAB_001136e8;
    if (puVar1[uVar4] == this->nullValue) {
      makeMove(this,row,col,row - 1,col);
      return UP;
    }
  }
  sVar2 = this->sizeInt;
  if (col < sVar2 - 1) {
    uVar4 = sVar2 * row + col + 1;
    puVar1 = (this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)(this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
    if (uVar5 <= uVar4) goto LAB_001136e8;
    if (puVar1[uVar4] == this->nullValue) {
      makeMove(this,row,col,row,col + 1);
      return RIGHT;
    }
  }
  if (row < sVar2 - 1) {
    uVar4 = sVar2 * (row + 1) + col;
    puVar1 = (this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)(this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
    if (uVar5 <= uVar4) goto LAB_001136e8;
    if (puVar1[uVar4] == this->nullValue) {
      makeMove(this,row,col,row + 1,col);
      return DOWN;
    }
  }
  MVar3 = NOT_ALLOWED;
  if (col != 0) {
    uVar4 = (col + sVar2 * row) - 1;
    puVar1 = (this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)(this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
    if (uVar5 <= uVar4) {
LAB_001136e8:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4,
                 uVar5);
    }
    if (puVar1[uVar4] == this->nullValue) {
      makeMove(this,row,col,row,col - 1);
      MVar3 = LEFT;
    }
  }
  return MVar3;
}

Assistant:

Move Board::checkMove( size_t row, size_t col )
{        
    if ( row > 0 && ( values.at(( row - 1 ) * sizeInt + col ) == nullValue ))
    {
        makeMove( row, col, row - 1, col );
        return Move::UP;
    }
    if ( col < ( sizeInt - 1 ) && ( values.at( row * sizeInt + col + 1 ) == nullValue ))
    {
        makeMove( row, col, row, col + 1 );
        return Move::RIGHT;
    }
    if ( row < ( sizeInt - 1 ) && ( values.at(( row + 1 ) * sizeInt + col )  == nullValue ))
    {
        makeMove( row, col, row + 1, col );
        return Move::DOWN;
    }
    if ( col > 0 && ( values.at( row * sizeInt + col - 1 ) == nullValue ))
    {
        makeMove( row, col, row, col -1 );
        return Move::LEFT;
    }

    return Move::NOT_ALLOWED;
}